

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::WindGroup> *
metaf::WindGroup::parseVariableSector
          (optional<metaf::WindGroup> *__return_storage_ptr__,string *group)

{
  bool bVar1;
  int iVar2;
  optional<metaf::Direction> oVar3;
  optional<metaf::Direction> oVar4;
  string_type sStack_68;
  smatch match;
  
  if (parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseVariableSector(std::__cxx11::string_const&)::
                                 varWindRgx_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_,
                 "(\\d\\d0)V(\\d\\d0)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_);
    }
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (group,&match,
                     &parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&sStack_68,&match,1);
    oVar3 = Direction::fromDegreesString(&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    if (((undefined1  [12])
         oVar3.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Direction> & (undefined1  [12])0x1) !=
        (undefined1  [12])0x0) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&sStack_68,&match,2);
      oVar4 = Direction::fromDegreesString(&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
      if (((undefined1  [12])
           oVar4.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Direction> & (undefined1  [12])0x1) !=
          (undefined1  [12])0x0) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload = 2;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
             NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wShHeight.distUnit =
             METERS;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin =
             (Direction)
             oVar3.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Direction>._M_payload;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd =
             (Direction)
             oVar4.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Direction>._M_payload;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
        goto LAB_0018959b;
      }
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
           super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
  super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
           super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
LAB_0018959b:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return __return_storage_ptr__;
}

Assistant:

std::optional<WindGroup> WindGroup::parseVariableSector(const std::string & group) {
	static const std::optional<WindGroup> notRecognised;
	static const std::regex varWindRgx("(\\d\\d0)V(\\d\\d0)");
	static const auto matchVarWindBegin = 1, matchVarWindEnd = 2;

	std::smatch match; 
	if (!std::regex_match(group, match, varWindRgx)) return notRecognised; 
	WindGroup result;
	const auto begin = Direction::fromDegreesString(match.str(matchVarWindBegin));
	if (!begin.has_value()) return notRecognised;
	result.vsecBegin = *begin;
	const auto end = Direction::fromDegreesString(match.str(matchVarWindEnd));
	if (!end.has_value()) return notRecognised;
	result.vsecEnd = *end;
	result.windType = Type::VARIABLE_WIND_SECTOR;
	return result;
}